

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *
testing::internal::
CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_superblock_size,aom_rc_mode>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>const,testing::internal::ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_superblock_size,aom_rc_mode>>const>
          (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
           *base)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *pIVar3;
  undefined8 uVar4;
  GTestLog local_c;
  
  if (base != (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>_>
               *)0x0) {
    __s1 = *(char **)(base->_vptr_ParamIteratorInterface[-1] + 8);
    if (__s1 == 
        "N7testing8internal25CartesianProductGeneratorIJPKN11libaom_test12CodecFactoryENS2_8TestModeE19aom_superblock_size11aom_rc_modeEE12IteratorImplINS0_13IndexSequenceIJLm0ELm1ELm2ELm3EEEEEE"
       ) {
      bVar1 = true;
    }
    else if (*__s1 == '*') {
      bVar1 = false;
    }
    else {
      iVar2 = strcmp(__s1,
                     "N7testing8internal25CartesianProductGeneratorIJPKN11libaom_test12CodecFactoryENS2_8TestModeE19aom_superblock_size11aom_rc_modeEE12IteratorImplINS0_13IndexSequenceIJLm0ELm1ELm2ELm3EEEEEE"
                    );
      bVar1 = iVar2 == 0;
    }
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
      GTestLog::~GTestLog(&local_c);
    }
    pIVar3 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *)
             __dynamic_cast(base,&ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_superblock_size,aom_rc_mode>>
                                  ::typeinfo,
                            &CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_superblock_size,aom_rc_mode>
                             ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::
                             typeinfo,0);
    return pIVar3;
  }
  uVar4 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar4);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}